

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalMapString.h
# Opt level: O3

void __thiscall
Js::EvalMapStringInternal<true>::EvalMapStringInternal
          (EvalMapStringInternal<true> *this,FinalizableObject *obj,char16 *content,int charLength,
          ModuleID moduleID,BOOL strict,BOOL isLibraryCode)

{
  CharacterBuffer<char16_t> *this_00;
  hash_t hVar1;
  
  this->owningVar = obj;
  this_00 = &this->str;
  Memory::Recycler::WBSetBit((char *)this_00);
  (this->str).string.ptr = content;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this_00);
  (this->str).len = charLength;
  this->moduleID = moduleID;
  this->strict = strict;
  this->isLibraryCode = isLibraryCode;
  hVar1 = JsUtil::CharacterBuffer<char16_t>::FastHash(this_00);
  this->hash = hVar1 * 2 + 1;
  return;
}

Assistant:

EvalMapStringInternal(FinalizableObject* obj, __in_ecount(charLength) char16 const* content, int charLength, ModuleID moduleID, BOOL strict, BOOL isLibraryCode)
            : owningVar(obj), str(content, charLength), moduleID(moduleID), strict(strict), isLibraryCode(isLibraryCode)
        {
            // NOTE: this hash is not equivalent to the character buffer hash
            // Don't use a CharacteBuffer to do a map lookup on the EvalMapString.
            if (fastHash)
            {
                hash = TAGHASH(str.FastHash());
            }
            else
            {
                hash = TAGHASH((hash_t)str);
            }
        }